

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O1

double __thiscall BmsBms::GetBaseBPM(BmsBms *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  BmsHeader *this_00;
  InvalidFormatAsBpmHeaderException *this_01;
  double dVar3;
  string local_40;
  double local_20;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BPM","");
  bVar2 = BmsHeaderTable::IsExists(&this->headers_,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (bVar2) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BPM","");
    this_00 = BmsHeaderTable::operator[](&this->headers_,&local_40);
    dVar3 = BmsHeader::ToFloat(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      local_20 = dVar3;
      operator_delete(local_40._M_dataplus._M_p);
      dVar3 = local_20;
    }
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      this_01 = (InvalidFormatAsBpmHeaderException *)__cxa_allocate_exception(8);
      InvalidFormatAsBpmHeaderException::InvalidFormatAsBpmHeaderException(this_01);
      __cxa_throw(this_01,&InvalidFormatAsBpmHeaderException::typeinfo,0);
    }
  }
  else {
    dVar3 = 120.0;
  }
  return dVar3;
}

Assistant:

double 
BmsBms::GetBaseBPM() {
	double bpm = BmsConst::BMS_BASIC_BPM;
	if (this->GetHeaders().IsExists("BPM")) {
		if ((bpm = this->GetHeaders()["BPM"].ToFloat()) == 0.0) {
			throw InvalidFormatAsBpmHeaderException();
		}
	}
	return bpm;
}